

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree_test.cpp
# Opt level: O0

Naive * __thiscall Naive::rangeUpdate(Naive *this,int fr,int to,ll x)

{
  vector<long_long,_std::allocator<long_long>_> *this_00;
  size_type sVar1;
  reference pvVar2;
  undefined4 local_38;
  int i;
  Naive *res;
  ll x_local;
  int to_local;
  int fr_local;
  Naive *this_local;
  
  this_00 = (vector<long_long,_std::allocator<long_long>_> *)operator_new(0x18);
  sVar1 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->vals);
  Naive((Naive *)this_00,(int)sVar1);
  std::vector<long_long,_std::allocator<long_long>_>::operator=(this_00,&this->vals);
  for (local_38 = fr; local_38 < to; local_38 = local_38 + 1) {
    pvVar2 = std::vector<long_long,_std::allocator<long_long>_>::operator[](this_00,(long)local_38);
    *pvVar2 = x + *pvVar2;
  }
  return (Naive *)this_00;
}

Assistant:

Naive* rangeUpdate(int fr, int to, ll x) const {
        auto res = new Naive(vals.size());
        res->vals = vals;
        rep(i, fr, to) {
            res->vals[i] += x;
        }
        return res;
    }